

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

int uECC_verify(uint8_t *public_key,uint8_t *hash,uint8_t *signature)

{
  EccPoint *pEVar1;
  cmpresult_t cVar2;
  bitcount_t bVar3;
  bitcount_t b;
  uECC_word_t uVar4;
  uECC_word_t uVar5;
  uECC_word_t index;
  uECC_word_t s [4];
  uECC_word_t r [4];
  bitcount_t i;
  bitcount_t numBits;
  EccPoint *point;
  EccPoint *points [4];
  uECC_word_t tz [4];
  uECC_word_t ty [4];
  uECC_word_t tx [4];
  uECC_word_t ry [4];
  uECC_word_t rx [4];
  EccPoint sum;
  EccPoint public;
  uECC_word_t z [4];
  uECC_word_t u2 [4];
  uECC_word_t u1 [4];
  uint8_t *signature_local;
  uint8_t *hash_local;
  uint8_t *public_key_local;
  
  s[2] = 0;
  vli_bytesToNative(sum.y + 3,public_key);
  vli_bytesToNative(public.x + 3,public_key + 0x20);
  vli_bytesToNative(s + 3,signature);
  vli_bytesToNative(&index,signature + 0x20);
  uVar4 = vli_isZero(s + 3);
  if ((uVar4 != 0) || (uVar4 = vli_isZero(&index), uVar4 != 0)) {
    return 0;
  }
  cVar2 = vli_cmp(curve_n,s + 3);
  if ((cVar2 == 1) && (cVar2 = vli_cmp(curve_n,&index), cVar2 == 1)) {
    vli_modInv(public.y + 3,&index,curve_n);
    vli_bytesToNative(u2 + 3,hash);
    vli_modMult_n(u2 + 3,u2 + 3,public.y + 3);
    vli_modMult_n(z + 3,s + 3,public.y + 3);
    vli_set(rx + 3,sum.y + 3);
    vli_set(sum.x + 3,public.x + 3);
    vli_set(ty + 3,curve_G.x);
    vli_set(tz + 3,curve_G.y);
    vli_modSub(public.y + 3,rx + 3,ty + 3,curve_p);
    XYcZ_add(ty + 3,tz + 3,rx + 3,sum.x + 3);
    vli_modInv(public.y + 3,public.y + 3,curve_p);
    apply_z(rx + 3,sum.x + 3,public.y + 3);
    points[0] = &curve_G;
    points[1] = (EccPoint *)(sum.y + 3);
    points[2] = (EccPoint *)(rx + 3);
    bVar3 = vli_numBits(u2 + 3,4);
    b = vli_numBits(z + 3,4);
    bVar3 = smax(bVar3,b);
    uVar4 = vli_testBit(u2 + 3,bVar3 + -1);
    uVar5 = vli_testBit(z + 3,bVar3 + -1);
    pEVar1 = points[(long)(int)((uint)(uVar4 != 0) | (uint)(uVar5 != 0) << 1) + -1];
    vli_set(ry + 3,pEVar1->x);
    vli_set(tx + 3,pEVar1->y);
    vli_clear(public.y + 3);
    public.y[3] = 1;
    for (r[3]._0_4_ = bVar3 + -2; -1 < (int)r[3]; r[3]._0_4_ = (int)r[3] + -1) {
      EccPoint_double_jacobian(ry + 3,tx + 3,public.y + 3);
      uVar4 = vli_testBit(u2 + 3,(int)r[3]);
      uVar5 = vli_testBit(z + 3,(int)r[3]);
      pEVar1 = points[(long)(int)((uint)(uVar4 != 0) | (uint)(uVar5 != 0) << 1) + -1];
      if (pEVar1 != (EccPoint *)0x0) {
        vli_set(ty + 3,pEVar1->x);
        vli_set(tz + 3,pEVar1->y);
        apply_z(ty + 3,tz + 3,public.y + 3);
        vli_modSub((uECC_word_t *)(points + 3),ry + 3,ty + 3,curve_p);
        XYcZ_add(ty + 3,tz + 3,ry + 3,tx + 3);
        vli_modMult_fast(public.y + 3,public.y + 3,(uECC_word_t *)(points + 3));
      }
    }
    vli_modInv(public.y + 3,public.y + 3,curve_p);
    apply_z(ry + 3,tx + 3,public.y + 3);
    cVar2 = vli_cmp(curve_n,ry + 3);
    if (cVar2 != 1) {
      vli_sub(ry + 3,ry + 3,curve_n);
    }
    cVar2 = vli_equal(ry + 3,s + 3);
    return cVar2;
  }
  return 0;
}

Assistant:

int uECC_verify(const uint8_t public_key[uECC_BYTES*2],
                const uint8_t hash[uECC_BYTES],
                const uint8_t signature[uECC_BYTES*2]) {
    uECC_word_t u1[uECC_N_WORDS], u2[uECC_N_WORDS];
    uECC_word_t z[uECC_N_WORDS];
    EccPoint public, sum;
    uECC_word_t rx[uECC_WORDS];
    uECC_word_t ry[uECC_WORDS];
    uECC_word_t tx[uECC_WORDS];
    uECC_word_t ty[uECC_WORDS];
    uECC_word_t tz[uECC_WORDS];
    const EccPoint *points[4];
    const EccPoint *point;
    bitcount_t numBits;
    bitcount_t i;
    uECC_word_t r[uECC_N_WORDS], s[uECC_N_WORDS];
    r[uECC_N_WORDS - 1] = 0;
    s[uECC_N_WORDS - 1] = 0;

    vli_bytesToNative(public.x, public_key);
    vli_bytesToNative(public.y, public_key + uECC_BYTES);
    vli_bytesToNative(r, signature);
    vli_bytesToNative(s, signature + uECC_BYTES);

    if (vli_isZero(r) || vli_isZero(s)) { /* r, s must not be 0. */
        return 0;
    }

#if (uECC_CURVE != uECC_secp160r1)
    if (vli_cmp(curve_n, r) != 1 || vli_cmp(curve_n, s) != 1) { /* r, s must be < n. */
        return 0;
    }
#endif

    /* Calculate u1 and u2. */
    vli_modInv_n(z, s, curve_n); /* Z = s^-1 */
    u1[uECC_N_WORDS - 1] = 0;
    vli_bytesToNative(u1, hash);
    vli_modMult_n(u1, u1, z); /* u1 = e/s */
    vli_modMult_n(u2, r, z); /* u2 = r/s */

    /* Calculate sum = G + Q. */
    vli_set(sum.x, public.x);
    vli_set(sum.y, public.y);
    vli_set(tx, curve_G.x);
    vli_set(ty, curve_G.y);
    vli_modSub_fast(z, sum.x, tx); /* Z = x2 - x1 */
    XYcZ_add(tx, ty, sum.x, sum.y);
    vli_modInv(z, z, curve_p); /* Z = 1/Z */
    apply_z(sum.x, sum.y, z);

    /* Use Shamir's trick to calculate u1*G + u2*Q */
    points[0] = 0;
    points[1] = &curve_G;
    points[2] = &public;
    points[3] = &sum;
    numBits = smax(vli_numBits(u1, uECC_N_WORDS), vli_numBits(u2, uECC_N_WORDS));

    point = points[(!!vli_testBit(u1, numBits - 1)) | ((!!vli_testBit(u2, numBits - 1)) << 1)];
    vli_set(rx, point->x);
    vli_set(ry, point->y);
    vli_clear(z);
    z[0] = 1;

    for (i = numBits - 2; i >= 0; --i) {
        uECC_word_t index;
        EccPoint_double_jacobian(rx, ry, z);

        index = (!!vli_testBit(u1, i)) | ((!!vli_testBit(u2, i)) << 1);
        point = points[index];
        if (point) {
            vli_set(tx, point->x);
            vli_set(ty, point->y);
            apply_z(tx, ty, z);
            vli_modSub_fast(tz, rx, tx); /* Z = x2 - x1 */
            XYcZ_add(tx, ty, rx, ry);
            vli_modMult_fast(z, z, tz);
        }
    }

    vli_modInv(z, z, curve_p); /* Z = 1/Z */
    apply_z(rx, ry, z);

    /* v = x1 (mod n) */
#if (uECC_CURVE != uECC_secp160r1)
    if (vli_cmp(curve_n, rx) != 1) {
        vli_sub(rx, rx, curve_n);
    }
#endif

    /* Accept only if v == r. */
    return vli_equal(rx, r);
}